

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_namenode_client.cc
# Opt level: O0

Future<VoidResponse> * __thiscall
NarpcNamenodeClient::SetFile(NarpcNamenodeClient *this,FileInfo *file_info,bool close)

{
  int iVar1;
  long in_RSI;
  FileInfo *in_RDI;
  shared_ptr<NarpcVoidResponse> response;
  shared_ptr<SetfileRequest> request;
  shared_ptr<NarpcVoidResponse> *in_stack_ffffffffffffff28;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffff30;
  shared_ptr<AsyncTask<VoidResponse>_> *task;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  FileInfo *__args;
  shared_ptr<AsyncTask<VoidResponse>_> local_90;
  undefined4 local_7c;
  shared_ptr<AsyncTask<VoidResponse>_> local_78 [3];
  long local_48;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffc0;
  shared_ptr<RpcMessage> *in_stack_ffffffffffffffc8;
  RpcClient *in_stack_ffffffffffffffd0;
  
  __args = in_RDI;
  std::make_shared<SetfileRequest,FileInfo&,bool&>
            (in_RDI,(bool *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_48 = in_RSI + 8;
  std::make_shared<NarpcVoidResponse,RpcClient*>((RpcClient **)__args);
  std::shared_ptr<RpcMessage>::shared_ptr<SetfileRequest,void>
            (in_stack_ffffffffffffff30,(shared_ptr<SetfileRequest> *)in_stack_ffffffffffffff28);
  task = local_78;
  std::shared_ptr<RpcMessage>::shared_ptr<NarpcVoidResponse,void>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iVar1 = RpcClient::IssueRequest
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x1668b9);
  std::shared_ptr<RpcMessage>::~shared_ptr((shared_ptr<RpcMessage> *)0x1668c3);
  if (iVar1 < 0) {
    Future<VoidResponse>::Failure();
  }
  else {
    std::shared_ptr<AsyncTask<VoidResponse>>::shared_ptr<NarpcVoidResponse,void>
              (&local_90,in_stack_ffffffffffffff28);
    Future<VoidResponse>::Future
              ((Future<VoidResponse> *)CONCAT44(iVar1,in_stack_ffffffffffffff50),task);
    std::shared_ptr<AsyncTask<VoidResponse>_>::~shared_ptr
              ((shared_ptr<AsyncTask<VoidResponse>_> *)0x166976);
  }
  local_7c = 1;
  std::shared_ptr<NarpcVoidResponse>::~shared_ptr((shared_ptr<NarpcVoidResponse> *)0x1669ad);
  std::shared_ptr<SetfileRequest>::~shared_ptr((shared_ptr<SetfileRequest> *)0x1669ba);
  return (Future<VoidResponse> *)in_RDI;
}

Assistant:

Future<VoidResponse> NarpcNamenodeClient::SetFile(FileInfo &file_info,
                                                  bool close) {
  shared_ptr<SetfileRequest> request =
      make_shared<SetfileRequest>(file_info, close);
  shared_ptr<NarpcVoidResponse> response =
      make_shared<NarpcVoidResponse>(&rpc_client_);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<VoidResponse>::Failure();
  }
  return Future<VoidResponse>(response);
}